

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void tile_mt_queue(AV1Decoder *pbi,int tile_cols,int tile_rows,int tile_rows_start,int tile_rows_end
                  ,int tile_cols_start,int tile_cols_end,int start_tile,int end_tile)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  AV1Decoder *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  AV1_COMMON *cm;
  int in_stack_00000018;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  AV1_COMMON *cm_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  cm_00 = &in_RDI->common;
  if (((in_RDI->tile_mt_info).alloc_tile_cols != in_ESI) ||
     ((in_RDI->tile_mt_info).alloc_tile_rows != in_EDX)) {
    av1_dealloc_dec_jobs((AV1DecTileMTData *)0x19e71e);
    alloc_dec_jobs((AV1DecTileMT *)CONCAT44(in_R9D,in_stack_ffffffffffffffe0),cm_00,
                   in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  }
  enqueue_tile_jobs(in_RDI,cm_00,in_ECX,in_R8D,in_R9D,in_stack_00000008,(int)cm,in_stack_00000018);
  qsort((in_RDI->tile_mt_info).job_queue,(long)(in_RDI->tile_mt_info).jobs_enqueued,0x10,
        compare_tile_buffers);
  return;
}

Assistant:

static inline void tile_mt_queue(AV1Decoder *pbi, int tile_cols, int tile_rows,
                                 int tile_rows_start, int tile_rows_end,
                                 int tile_cols_start, int tile_cols_end,
                                 int start_tile, int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  if (pbi->tile_mt_info.alloc_tile_cols != tile_cols ||
      pbi->tile_mt_info.alloc_tile_rows != tile_rows) {
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
    alloc_dec_jobs(&pbi->tile_mt_info, cm, tile_rows, tile_cols);
  }
  enqueue_tile_jobs(pbi, cm, tile_rows_start, tile_rows_end, tile_cols_start,
                    tile_cols_end, start_tile, end_tile);
  qsort(pbi->tile_mt_info.job_queue, pbi->tile_mt_info.jobs_enqueued,
        sizeof(pbi->tile_mt_info.job_queue[0]), compare_tile_buffers);
}